

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fillpen.c
# Opt level: O2

fillpen_t *
fillpen_init(dict_t *dict,char *file,float64 silprob,float64 fillprob,float64 lw,float64 wip,
            logmath_t *logmath)

{
  int32 iVar1;
  int32 iVar2;
  s3wid_t sVar3;
  fillpen_t *pfVar4;
  int32 *piVar5;
  FILE *__stream;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lStack_870;
  float64 local_840;
  char line [1024];
  char wd [1024];
  
  pfVar4 = (fillpen_t *)
           __ckd_calloc__(1,0x30,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
                          ,0x5c);
  pfVar4->dict = dict;
  pfVar4->lw = lw;
  pfVar4->wip = wip;
  pfVar4->silprob = silprob;
  pfVar4->fillerprob = fillprob;
  iVar9 = dict->filler_start;
  if (dict->filler_end < iVar9) {
    piVar5 = (int32 *)0x0;
  }
  else {
    piVar5 = (int32 *)__ckd_calloc__((long)((dict->filler_end - iVar9) + 1),4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
                                     ,0x66);
    iVar9 = dict->filler_start;
  }
  pfVar4->prob = piVar5;
  for (lVar10 = (long)iVar9; (int)lVar10 <= dict->filler_end; lVar10 = lVar10 + 1) {
    iVar1 = logs3(logmath,fillprob);
    iVar2 = logs3(logmath,wip);
    pfVar4->prob[lVar10 - dict->filler_start] = (int)((double)iVar1 * (double)lw + (double)iVar2);
  }
  sVar3 = dict_wordid(dict,"<sil>");
  if (((-1 < sVar3) && (dict->filler_start <= sVar3)) && (sVar3 <= dict->filler_end)) {
    local_840 = silprob;
    iVar1 = logs3(logmath,silprob);
    iVar2 = logs3(logmath,wip);
    pfVar4->prob[(long)sVar3 - (long)dict->filler_start] =
         (int)((double)iVar1 * (double)lw + (double)iVar2);
    if (file != (char *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
              ,0x7d,"Reading filler penalty file: %s\n",file);
      __stream = fopen(file,"r");
      if (__stream == (FILE *)0x0) {
        pcVar6 = "fopen(%s,r) failed\n";
        lStack_870 = 0x7f;
        goto LAB_0010d7fa;
      }
      while( true ) {
        pcVar6 = fgets(line,0x400,__stream);
        if (pcVar6 == (char *)0x0) break;
        if (line[0] != '#') {
          uVar7 = __isoc99_sscanf(line,"%s %lf",wd,&local_840);
          if ((uVar7 & 0xfffffffd) != 0) {
            pcVar6 = "Bad input line: %s\n";
            file = line;
            lStack_870 = 0x86;
            goto LAB_0010d7fa;
          }
          sVar3 = dict_wordid(dict,wd);
          if (((sVar3 < 0) || (sVar3 < dict->filler_start)) || (dict->filler_end < sVar3)) {
            pcVar6 = "%s not a filler word in the given dictionary\n";
            file = "<sil>";
            lStack_870 = 0x8b;
            goto LAB_0010d7fa;
          }
          iVar1 = logs3(logmath,local_840);
          iVar2 = logs3(logmath,wip);
          pfVar4->prob[(long)sVar3 - (long)dict->filler_start] =
               (int)((double)iVar1 * (double)lw + (double)iVar2);
        }
      }
      fclose(__stream);
      lVar8 = (long)dict->filler_start;
      lVar10 = lVar8 * 4;
      for (; lVar8 <= dict->filler_end; lVar8 = lVar8 + 1) {
        iVar9 = (&dict->word->basewid)[lVar10 * 2];
        if ((int)lVar8 != iVar9) {
          *(int32 *)((long)pfVar4->prob + lVar10 + (long)dict->filler_start * -4) =
               pfVar4->prob[(long)iVar9 - (long)dict->filler_start];
        }
        lVar10 = lVar10 + 4;
      }
    }
    return pfVar4;
  }
  pcVar6 = "%s not a filler word in the given dictionary\n";
  file = "<sil>";
  lStack_870 = 0x74;
LAB_0010d7fa:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
          ,lStack_870,pcVar6,file);
  exit(1);
}

Assistant:

fillpen_t *
fillpen_init(dict_t * dict, const char *file, float64 silprob, float64 fillprob,
             float64 lw, float64 wip, logmath_t *logmath)
{
    s3wid_t w, bw;
    float64 prob;
    FILE *fp;
    char line[1024], wd[1024];
    int32 k;
    fillpen_t *_fillpen;

    _fillpen = (fillpen_t *) ckd_calloc(1, sizeof(fillpen_t));

    _fillpen->dict = dict;
    _fillpen->lw = lw;
    _fillpen->wip = wip;
    _fillpen->silprob = silprob;
    _fillpen->fillerprob = fillprob;
    if (dict->filler_end >= dict->filler_start)
        _fillpen->prob =
            (int32 *) ckd_calloc(dict->filler_end - dict->filler_start + 1,
                                 sizeof(int32));
    else
        _fillpen->prob = NULL;

    /* Initialize all words with filler penalty (HACK!! backward compatibility) */
    prob = fillprob;
    for (w = dict->filler_start; w <= dict->filler_end; w++)
    _fillpen->prob[w - dict->filler_start] =
        (int32) ((logs3(logmath, prob) * lw + logs3(logmath, wip)));

    /* Overwrite silence penalty (HACK!! backward compatibility) */
    w = dict_wordid(dict, S3_SILENCE_WORD);
    if (NOT_S3WID(w) || (w < dict->filler_start) || (w > dict->filler_end))
        E_FATAL("%s not a filler word in the given dictionary\n",
                S3_SILENCE_WORD);
    prob = silprob;
    _fillpen->prob[w - dict->filler_start] =
        (int32) ((logs3(logmath, prob) * lw + logs3(logmath, wip)));

    /* Overwrite with filler prob input file, if specified */
    if (!file)
        return _fillpen;

    E_INFO("Reading filler penalty file: %s\n", file);
    if ((fp = fopen(file, "r")) == NULL)
        E_FATAL("fopen(%s,r) failed\n", file);
    while (fgets(line, sizeof(line), fp) != NULL) {
        if (line[0] == '#')     /* Skip comment lines */
            continue;

        k = sscanf(line, "%s %lf", wd, &prob);
        if ((k != 0) && (k != 2))
            E_FATAL("Bad input line: %s\n", line);
        w = dict_wordid(dict, wd);
        if (NOT_S3WID(w) || (w < dict->filler_start)
            || (w > dict->filler_end))
            E_FATAL("%s not a filler word in the given dictionary\n",
                    S3_SILENCE_WORD);

        _fillpen->prob[w - dict->filler_start] =
            (int32) ((logs3(logmath, prob) * lw + logs3(logmath, wip)));
    }
    fclose(fp);

    /* Replicate fillpen values for alternative pronunciations */
    for (w = dict->filler_start; w <= dict->filler_end; w++) {
        bw = dict_basewid(dict, w);
        if (bw != w)
            _fillpen->prob[w - dict->filler_start] =
                _fillpen->prob[bw - dict->filler_start];
    }

    return _fillpen;
}